

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O0

void __thiscall
script_standard_tests::script_standard_Solver_success::test_method
          (script_standard_Solver_success *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  span<const_unsigned_char,_18446744073709551615UL> b_05;
  span<const_unsigned_char,_18446744073709551615UL> b_06;
  span<const_unsigned_char,_18446744073709551615UL> b_07;
  span<const_unsigned_char,_18446744073709551615UL> b_08;
  span<const_unsigned_char,_18446744073709551615UL> b_09;
  span<const_unsigned_char,_18446744073709551615UL> b_10;
  span<const_unsigned_char,_18446744073709551615UL> b_11;
  span<const_unsigned_char,_18446744073709551615UL> b_12;
  span<const_unsigned_char,_18446744073709551615UL> b_13;
  span<const_unsigned_char,_18446744073709551615UL> b_14;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *vSolutionsRet;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffdf48;
  lazy_ostream *in_stack_ffffffffffffdf50;
  char *in_stack_ffffffffffffdf58;
  CSHA256 *in_stack_ffffffffffffdf60;
  CScript *in_stack_ffffffffffffdf68;
  CKey *in_stack_ffffffffffffdf70;
  undefined4 in_stack_ffffffffffffdf78;
  opcodetype in_stack_ffffffffffffdf7c;
  const_string *in_stack_ffffffffffffdf80;
  CKey *pCVar3;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffdf88;
  CKey *pCVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffdf90;
  undefined4 in_stack_ffffffffffffdf98;
  undefined4 in_stack_ffffffffffffdf9c;
  CScript *in_stack_ffffffffffffdfa0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffe070;
  undefined7 in_stack_ffffffffffffe078;
  undefined1 in_stack_ffffffffffffe07f;
  CPubKey *local_19e0;
  CKey *local_19c8;
  int i;
  script_standard_Solver_success *this_local;
  lazy_ostream local_18f0;
  undefined1 local_18d8 [64];
  const_string local_1898 [2];
  lazy_ostream local_1878 [2];
  assertion_result local_1858 [2];
  const_string local_1820 [2];
  lazy_ostream local_1800 [2];
  assertion_result local_17e0 [2];
  const_string local_17a8 [2];
  lazy_ostream local_1788 [2];
  assertion_result local_1768 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_program;
  int version;
  const_string local_1710 [2];
  lazy_ostream local_16f0 [2];
  assertion_result local_16d0 [2];
  lazy_ostream local_1698;
  undefined1 local_1680 [88];
  vector<unsigned_char,_std::allocator<unsigned_char>_> anchor_bytes;
  const_string local_1610 [2];
  lazy_ostream local_15f0 [3];
  assertion_result local_15b8 [2];
  const_string local_1580 [2];
  lazy_ostream local_1560 [4];
  assertion_result local_1520 [2];
  lazy_ostream local_14e4;
  undefined1 local_14c8 [64];
  lazy_ostream local_1488;
  undefined1 local_1470 [104];
  const_string local_1408 [2];
  lazy_ostream local_13e8 [3];
  assertion_result local_13b0 [2];
  lazy_ostream local_1374;
  undefined1 local_1358 [64];
  lazy_ostream local_1318;
  undefined1 local_1300 [104];
  const_string local_1298 [2];
  lazy_ostream local_1278 [3];
  assertion_result local_1240 [2];
  lazy_ostream local_1204;
  undefined1 local_11e8 [64];
  lazy_ostream local_11a8;
  undefined1 local_1190 [104];
  const_string local_1128 [2];
  lazy_ostream local_1108 [3];
  assertion_result local_10d0 [2];
  lazy_ostream local_1094;
  undefined1 local_1078 [64];
  lazy_ostream local_1038;
  undefined1 local_1020 [32];
  undefined8 local_1000;
  lazy_ostream local_fb4;
  undefined1 local_f98 [64];
  lazy_ostream local_f58;
  undefined1 local_f40 [208];
  const_string local_e70 [2];
  lazy_ostream local_e50 [4];
  assertion_result local_e10 [2];
  const_string local_dd8 [2];
  lazy_ostream local_db8 [3];
  assertion_result local_d80 [2];
  const_string local_d48 [2];
  lazy_ostream local_d28 [3];
  assertion_result local_cf0 [2];
  const_string local_cb8 [2];
  lazy_ostream local_c98 [3];
  assertion_result local_c60 [2];
  const_string local_c28 [2];
  lazy_ostream local_c08 [4];
  assertion_result local_bc8 [2];
  lazy_ostream local_b8c;
  undefined1 local_b70 [64];
  lazy_ostream local_b30;
  undefined1 local_b18 [184];
  const_string local_a60 [2];
  lazy_ostream local_a40 [4];
  assertion_result local_a00 [2];
  const_string local_9c8 [2];
  lazy_ostream local_9a8 [3];
  assertion_result local_970 [2];
  const_string local_938 [2];
  lazy_ostream local_918 [3];
  assertion_result local_8e0 [2];
  const_string local_8a8 [2];
  lazy_ostream local_888 [4];
  assertion_result local_848 [2];
  lazy_ostream local_80c;
  undefined1 local_7f0 [64];
  lazy_ostream local_7b0;
  undefined1 local_798 [144];
  const_string local_708 [2];
  lazy_ostream local_6e8 [3];
  assertion_result local_6b0 [2];
  lazy_ostream local_674;
  undefined1 local_658 [64];
  lazy_ostream local_618;
  undefined1 local_600 [104];
  const_string local_598 [2];
  lazy_ostream local_578 [3];
  assertion_result local_540 [2];
  lazy_ostream local_504;
  undefined1 local_4e8 [64];
  lazy_ostream local_4a8;
  undefined1 local_490 [104];
  const_string local_428 [2];
  lazy_ostream local_408 [3];
  assertion_result local_3d0 [2];
  lazy_ostream local_394;
  undefined1 local_378 [64];
  lazy_ostream local_338;
  undefined1 local_320 [104];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions;
  uint256 scriptHash;
  CScript redeemScript;
  CScript s;
  undefined1 local_149 [65];
  CPubKey pubkeys [3];
  undefined1 auStack_45 [13];
  CKey keys [3];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_19c8 = keys;
  do {
    CKey::CKey((CKey *)in_stack_ffffffffffffdf48);
    local_19c8 = local_19c8 + 1;
  } while (local_19c8 != (CKey *)&stack0xfffffffffffffff8);
  local_19e0 = pubkeys;
  do {
    CPubKey::CPubKey((CPubKey *)in_stack_ffffffffffffdf48);
    local_19e0 = local_19e0 + 1;
  } while (local_19e0 != (CPubKey *)auStack_45);
  for (i = 0; i < 3; i = i + 1) {
    CKey::MakeNewKey((CKey *)in_stack_ffffffffffffdf58,
                     SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    CKey::GetPubKey(in_stack_ffffffffffffdf70);
    memcpy(pubkeys + i,local_149,0x41);
  }
  CScript::CScript((CScript *)in_stack_ffffffffffffdf48);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_ffffffffffffdf48);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_338._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_338._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffdf58 = "TxoutType::PUBKEY";
    in_stack_ffffffffffffdf50 = &local_338;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_320,&local_338.m_empty,0x2c,1,2,
               (undefined1 *)((long)&local_338._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_394._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_394._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffdf58 = "1U";
    in_stack_ffffffffffffdf50 = &local_394;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_378,&local_394.field_0xc,0x2d,1,2,
               (undefined1 *)((long)&local_394._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d0,local_408,local_428,0x2e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CPubKey::GetID((CPubKey *)in_stack_ffffffffffffdf70);
  ToByteVector<CKeyID>((CKeyID *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_00._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_00._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_00);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_4a8._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_4a8._vptr_lazy_ostream._0_4_ = 3;
    in_stack_ffffffffffffdf58 = "TxoutType::PUBKEYHASH";
    in_stack_ffffffffffffdf50 = &local_4a8;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_490,&local_4a8.m_empty,0x33,1,2,
               (undefined1 *)((long)&local_4a8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_504._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_504._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffdf58 = "1U";
    in_stack_ffffffffffffdf50 = &local_504;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_4e8,&local_504.field_0xc,0x34,1,2,
               (undefined1 *)((long)&local_504._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    CPubKey::GetID((CPubKey *)in_stack_ffffffffffffdf70);
    ToByteVector<CKeyID>((CKeyID *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_540,local_578,local_598,0x35,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::CScript((CScript *)in_stack_ffffffffffffdf48,(CScript *)0xa09be4);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScriptID::CScriptID((CScriptID *)in_stack_ffffffffffffdf60,(CScript *)in_stack_ffffffffffffdf58);
  ToByteVector<CScriptID>((CScriptID *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_01._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_01._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_01);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_618._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_618._vptr_lazy_ostream._0_4_ = 4;
    in_stack_ffffffffffffdf58 = "TxoutType::SCRIPTHASH";
    in_stack_ffffffffffffdf50 = &local_618;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_600,&local_618.m_empty,0x3b,1,2,
               (undefined1 *)((long)&local_618._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_674._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_674._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffdf58 = "1U";
    in_stack_ffffffffffffdf50 = &local_674;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_658,&local_674.field_0xc,0x3c,1,2,
               (undefined1 *)((long)&local_674._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    CScriptID::CScriptID
              ((CScriptID *)in_stack_ffffffffffffdf60,(CScript *)in_stack_ffffffffffffdf58);
    ToByteVector<CScriptID>((CScriptID *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6b0,local_6e8,local_708,0x3d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_02._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_02._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_02);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_03._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_03._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_03);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_7b0._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_7b0._vptr_lazy_ostream._0_4_ = 5;
    in_stack_ffffffffffffdf58 = "TxoutType::MULTISIG";
    in_stack_ffffffffffffdf50 = &local_7b0;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_798,&local_7b0.m_empty,0x45,1,2,
               (undefined1 *)((long)&local_7b0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_80c._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_80c._vptr_lazy_ostream._0_4_ = 4;
    in_stack_ffffffffffffdf58 = "4U";
    in_stack_ffffffffffffdf50 = &local_80c;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_7f0,&local_80c.field_0xc,0x46,1,2,
               (undefined1 *)((long)&local_80c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
    __l._M_len._0_4_ = in_stack_ffffffffffffdf98;
    __l._M_array = (iterator)in_stack_ffffffffffffdf90;
    __l._M_len._4_4_ = in_stack_ffffffffffffdf9c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffdf88._M_extent_value,__l,
               (allocator_type *)in_stack_ffffffffffffdf80);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_848,local_888,local_8a8,0x47,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8e0,local_918,local_938,0x48,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_970,local_9a8,local_9c8,0x49,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
    __l_00._M_len._0_4_ = in_stack_ffffffffffffdf98;
    __l_00._M_array = (iterator)in_stack_ffffffffffffdf90;
    __l_00._M_len._4_4_ = in_stack_ffffffffffffdf9c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffdf88._M_extent_value,__l_00,
               (allocator_type *)in_stack_ffffffffffffdf80);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a00,local_a40,local_a60,0x4a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_04._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_04._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_04);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_05._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_05._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_05);
  ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_06._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_06._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_06);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_b30._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_b30._vptr_lazy_ostream._0_4_ = 5;
    in_stack_ffffffffffffdf58 = "TxoutType::MULTISIG";
    in_stack_ffffffffffffdf50 = &local_b30;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_b18,&local_b30.m_empty,0x52,1,2,
               (undefined1 *)((long)&local_b30._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_b8c._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_b8c._vptr_lazy_ostream._0_4_ = 5;
    in_stack_ffffffffffffdf58 = "5U";
    in_stack_ffffffffffffdf50 = &local_b8c;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_b70,&local_b8c.field_0xc,0x53,1,2,
               (undefined1 *)((long)&local_b8c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
    __l_01._M_len._0_4_ = in_stack_ffffffffffffdf98;
    __l_01._M_array = (iterator)in_stack_ffffffffffffdf90;
    __l_01._M_len._4_4_ = in_stack_ffffffffffffdf9c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffdf88._M_extent_value,__l_01,
               (allocator_type *)in_stack_ffffffffffffdf80);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bc8,local_c08,local_c28,0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c60,local_c98,local_cb8,0x55,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cf0,local_d28,local_d48,0x56,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<CPubKey>((CPubKey *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d80,local_db8,local_dd8,0x57,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
    __l_02._M_len._0_4_ = in_stack_ffffffffffffdf98;
    __l_02._M_array = (iterator)in_stack_ffffffffffffdf90;
    __l_02._M_len._4_4_ = in_stack_ffffffffffffdf9c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffdf88._M_extent_value,__l_02,
               (allocator_type *)in_stack_ffffffffffffdf80);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e10,local_e50,local_e70,0x58,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  __l_03._M_len._0_4_ = in_stack_ffffffffffffdf98;
  __l_03._M_array = (iterator)in_stack_ffffffffffffdf90;
  __l_03._M_len._4_4_ = in_stack_ffffffffffffdf9c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffdf88._M_extent_value,__l_03,
             (allocator_type *)in_stack_ffffffffffffdf80);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_07._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_07._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_07);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  __l_04._M_len._0_4_ = in_stack_ffffffffffffdf98;
  __l_04._M_array = (iterator)in_stack_ffffffffffffdf90;
  __l_04._M_len._4_4_ = in_stack_ffffffffffffdf9c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffdf88._M_extent_value,__l_04,
             (allocator_type *)in_stack_ffffffffffffdf80);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_08._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_08._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_08);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  __l_05._M_len._0_4_ = in_stack_ffffffffffffdf98;
  __l_05._M_array = (iterator)in_stack_ffffffffffffdf90;
  __l_05._M_len._4_4_ = in_stack_ffffffffffffdf9c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffdf88._M_extent_value,__l_05,
             (allocator_type *)in_stack_ffffffffffffdf80);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_09._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_09._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_09);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_f58._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_f58._vptr_lazy_ostream._0_4_ = 6;
    in_stack_ffffffffffffdf58 = "TxoutType::NULL_DATA";
    in_stack_ffffffffffffdf50 = &local_f58;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_f40,&local_f58.m_empty,0x60,1,2,
               (undefined1 *)((long)&local_f58._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_fb4._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_fb4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffdf58 = "0U";
    in_stack_ffffffffffffdf50 = &local_fb4;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_f98,&local_fb4.field_0xc,0x61,1,2,
               (undefined1 *)((long)&local_fb4._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CPubKey::GetID((CPubKey *)in_stack_ffffffffffffdf70);
  ToByteVector<CKeyID>((CKeyID *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_10._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_10._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_1038._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_1038._vptr_lazy_ostream._0_4_ = 8;
    in_stack_ffffffffffffdf58 = "TxoutType::WITNESS_V0_KEYHASH";
    in_stack_ffffffffffffdf50 = &local_1038;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_1020,&local_1038.m_empty,0x66,1,2,
               (undefined1 *)((long)&local_1038._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_1094._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_1094._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffdf58 = "1U";
    in_stack_ffffffffffffdf50 = &local_1094;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1078,&local_1094.field_0xc,0x67,1,2,
               (undefined1 *)((long)&local_1094._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    CPubKey::GetID((CPubKey *)in_stack_ffffffffffffdf70);
    ToByteVector<CKeyID>((CKeyID *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10d0,local_1108,local_1128,0x68,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uint256::uint256((uint256 *)in_stack_ffffffffffffdf48);
  CSHA256::CSHA256((CSHA256 *)in_stack_ffffffffffffdf48);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::data
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffdf48);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::size
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_ffffffffffffdf58);
  CSHA256::Write((CSHA256 *)CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                 &in_stack_ffffffffffffdf70->fCompressed,(size_t)in_stack_ffffffffffffdf68);
  base_blob<256U>::begin((base_blob<256U> *)in_stack_ffffffffffffdf48);
  CSHA256::Finalize(in_stack_ffffffffffffdf60,(uchar *)in_stack_ffffffffffffdf58);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  ToByteVector<uint256>((uint256 *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_11._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_11._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_11);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_11a8._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_11a8._vptr_lazy_ostream._0_4_ = 7;
    in_stack_ffffffffffffdf58 = "TxoutType::WITNESS_V0_SCRIPTHASH";
    in_stack_ffffffffffffdf50 = &local_11a8;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_1190,&local_11a8.m_empty,0x71,1,2,
               (undefined1 *)((long)&local_11a8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_1204._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_1204._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffdf58 = "1U";
    in_stack_ffffffffffffdf50 = &local_1204;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_11e8,&local_1204.field_0xc,0x72,1,2,
               (undefined1 *)((long)&local_1204._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<uint256>((uint256 *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1240,local_1278,local_1298,0x73,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  ToByteVector<uint256>((uint256 *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_12._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_12._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_12);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_1318._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_1318._vptr_lazy_ostream._0_4_ = 9;
    in_stack_ffffffffffffdf58 = "TxoutType::WITNESS_V1_TAPROOT";
    in_stack_ffffffffffffdf50 = &local_1318;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_1300,&local_1318.m_empty,0x78,1,2,
               (undefined1 *)((long)&local_1318._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_1374._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_1374._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffdf58 = "1U";
    in_stack_ffffffffffffdf50 = &local_1374;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1358,&local_1374.field_0xc,0x79,1,2,
               (undefined1 *)((long)&local_1374._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<uint256>((uint256 *)in_stack_ffffffffffffdf88._M_extent_value);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13b0,local_13e8,local_1408,0x7a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  ToByteVector<uint256>((uint256 *)in_stack_ffffffffffffdf88._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_13._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_13._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_13);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_1488._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(in_stack_ffffffffffffe07f,in_stack_ffffffffffffe078),
                in_stack_ffffffffffffe070);
    local_1488._vptr_lazy_ostream._0_4_ = 10;
    in_stack_ffffffffffffdf58 = "TxoutType::WITNESS_UNKNOWN";
    in_stack_ffffffffffffdf50 = &local_1488;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_1470,&local_1488.m_empty,0x7f,1,2,
               (undefined1 *)((long)&local_1488._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_14e4._4_8_ =
         std::
         vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_ffffffffffffdf48);
    local_14e4._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffdf58 = "2U";
    in_stack_ffffffffffffdf50 = &local_14e4;
    in_stack_ffffffffffffdf48 = "solutions.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_14c8,&local_14e4.field_0xc,0x80,1,2,
               (undefined1 *)((long)&local_14e4._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
    __l_06._M_len._0_4_ = in_stack_ffffffffffffdf98;
    __l_06._M_array = (iterator)in_stack_ffffffffffffdf90;
    __l_06._M_len._4_4_ = in_stack_ffffffffffffdf9c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffdf88._M_extent_value,__l_06,
               (allocator_type *)in_stack_ffffffffffffdf80);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1520,local_1560,local_1580,0x81,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_ffffffffffffdf58,(size_type)in_stack_ffffffffffffdf50);
    ToByteVector<uint256>((uint256 *)in_stack_ffffffffffffdf88._M_extent_value);
    uVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            in_stack_ffffffffffffdf70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    vSolutionsRet = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_15b8,local_15f0,local_1610,0x82,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  __l_07._M_len._0_4_ = in_stack_ffffffffffffdf98;
  __l_07._M_array = (iterator)in_stack_ffffffffffffdf90;
  __l_07._M_len._4_4_ = in_stack_ffffffffffffdf9c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffdf88._M_extent_value,__l_07,
             (allocator_type *)in_stack_ffffffffffffdf80);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffdf48);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdf58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
  b_14._M_extent._M_extent_value = in_stack_ffffffffffffdf88._M_extent_value;
  b_14._M_ptr = (pointer)in_stack_ffffffffffffdf80;
  CScript::operator<<(in_stack_ffffffffffffdf68,b_14);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_1698._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(uVar2,in_stack_ffffffffffffe078),
                (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)vSolutionsRet);
    local_1698._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffdf58 = "TxoutType::ANCHOR";
    in_stack_ffffffffffffdf50 = &local_1698;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_1680,&local_1698.m_empty,0x88,1,2,
               (undefined1 *)((long)&local_1698._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_ffffffffffffdf58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_16d0,local_16f0,local_1710,0x89,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    CScript::IsPayToAnchor((CScript *)in_stack_ffffffffffffdf58);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1768,local_1788,local_17a8,0x8e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    CScript::IsWitnessProgram
              (in_stack_ffffffffffffdfa0,
               (int *)CONCAT44(in_stack_ffffffffffffdf9c,in_stack_ffffffffffffdf98),
               in_stack_ffffffffffffdf90);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_17e0,local_1800,local_1820,0x8f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    CScript::IsPayToAnchor
              ((int)((ulong)in_stack_ffffffffffffdf58 >> 0x20),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf50);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf58,
               SUB81((ulong)in_stack_ffffffffffffdf50 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffdf50,(basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    in_stack_ffffffffffffdf48 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1858,local_1878,local_1898,0x90,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdf48);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::clear((CScript *)in_stack_ffffffffffffdf48);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  CScript::operator<<((CScript *)in_stack_ffffffffffffdf80,in_stack_ffffffffffffdf7c);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdf88._M_extent_value,
               in_stack_ffffffffffffdf80,
               CONCAT44(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78),
               (const_string *)in_stack_ffffffffffffdf70);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffdf50,(char (*) [1])in_stack_ffffffffffffdf48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdf58,
               (pointer)in_stack_ffffffffffffdf50,(unsigned_long)in_stack_ffffffffffffdf48);
    local_18f0._vptr_lazy_ostream._4_4_ =
         Solver((CScript *)CONCAT17(uVar2,in_stack_ffffffffffffe078),
                (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)vSolutionsRet);
    local_18f0._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffdf58 = "TxoutType::NONSTANDARD";
    in_stack_ffffffffffffdf50 = &local_18f0;
    in_stack_ffffffffffffdf48 = "Solver(s, solutions)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,TxoutType,TxoutType>
              (local_18d8,&local_18f0.m_empty,0x95,1,2,
               (undefined1 *)((long)&local_18f0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffdf48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdf58);
  CScript::~CScript((CScript *)in_stack_ffffffffffffdf48);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_ffffffffffffdf58);
  CScript::~CScript((CScript *)in_stack_ffffffffffffdf48);
  pCVar4 = keys;
  pCVar3 = (CKey *)&stack0xfffffffffffffff8;
  do {
    pCVar3 = pCVar3 + -1;
    CKey::~CKey((CKey *)in_stack_ffffffffffffdf48);
  } while (pCVar3 != pCVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_Solver_success)
{
    CKey keys[3];
    CPubKey pubkeys[3];
    for (int i = 0; i < 3; i++) {
        keys[i].MakeNewKey(true);
        pubkeys[i] = keys[i].GetPubKey();
    }

    CScript s;
    std::vector<std::vector<unsigned char> > solutions;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkeys[0]) << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEY);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0]));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkeys[0].GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::PUBKEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(CScriptID(redeemScript)));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 4U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({1}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == std::vector<unsigned char>({2}));

    s.clear();
    s << OP_2 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        ToByteVector(pubkeys[2]) <<
        OP_3 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::MULTISIG);
    BOOST_CHECK_EQUAL(solutions.size(), 5U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>({2}));
    BOOST_CHECK(solutions[1] == ToByteVector(pubkeys[0]));
    BOOST_CHECK(solutions[2] == ToByteVector(pubkeys[1]));
    BOOST_CHECK(solutions[3] == ToByteVector(pubkeys[2]));
    BOOST_CHECK(solutions[4] == std::vector<unsigned char>({3}));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN <<
        std::vector<unsigned char>({0}) <<
        std::vector<unsigned char>({75}) <<
        std::vector<unsigned char>({255});
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NULL_DATA);
    BOOST_CHECK_EQUAL(solutions.size(), 0U);

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkeys[0].GetID());
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_KEYHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(pubkeys[0].GetID()));

    // TxoutType::WITNESS_V0_SCRIPTHASH
    uint256 scriptHash;
    CSHA256().Write(redeemScript.data(), redeemScript.size())
        .Finalize(scriptHash.begin());

    s.clear();
    s << OP_0 << ToByteVector(scriptHash);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V0_SCRIPTHASH);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(scriptHash));

    // TxoutType::WITNESS_V1_TAPROOT
    s.clear();
    s << OP_1 << ToByteVector(uint256::ZERO);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_V1_TAPROOT);
    BOOST_CHECK_EQUAL(solutions.size(), 1U);
    BOOST_CHECK(solutions[0] == ToByteVector(uint256::ZERO));

    // TxoutType::WITNESS_UNKNOWN
    s.clear();
    s << OP_16 << ToByteVector(uint256::ONE);
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::WITNESS_UNKNOWN);
    BOOST_CHECK_EQUAL(solutions.size(), 2U);
    BOOST_CHECK(solutions[0] == std::vector<unsigned char>{16});
    BOOST_CHECK(solutions[1] == ToByteVector(uint256::ONE));

    // TxoutType::ANCHOR
    std::vector<unsigned char> anchor_bytes{0x4e, 0x73};
    s.clear();
    s << OP_1 << anchor_bytes;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::ANCHOR);
    BOOST_CHECK(solutions.empty());

    // Sanity-check IsPayToAnchor
    int version{-1};
    std::vector<unsigned char> witness_program;
    BOOST_CHECK(s.IsPayToAnchor());
    BOOST_CHECK(s.IsWitnessProgram(version, witness_program));
    BOOST_CHECK(CScript::IsPayToAnchor(version, witness_program));

    // TxoutType::NONSTANDARD
    s.clear();
    s << OP_9 << OP_ADD << OP_11 << OP_EQUAL;
    BOOST_CHECK_EQUAL(Solver(s, solutions), TxoutType::NONSTANDARD);
}